

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::writeDescriptorSet
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet,
          VkDescriptorSetLayout layout,VkPipelineLayout pipelineLayout)

{
  DescriptorSetUpdateBuilder *pDVar1;
  ShaderInputInterface SVar2;
  DescriptorUpdateMethod DVar3;
  VkDescriptorImageInfo *pVVar4;
  Location LStack_90;
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  undefined8 uStack_68;
  undefined1 auStack_60 [16];
  deUint64 dStack_50;
  VkDescriptorBufferInfo VStack_48;
  
  switch(this->m_updateMethod) {
  case DESCRIPTOR_UPDATE_METHOD_NORMAL:
    if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) {
        return;
      }
      VStack_48.offset =
           (this->m_result).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
           m_internal;
      VStack_48.range = 0;
      dStack_50 = (this->m_images).super_ImageInstanceImages.m_imageViewA.
                  super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      auStack_60._8_8_ = 0;
      VStack_48.buffer.m_internal._0_4_ = 5;
      auStack_88._0_8_ =
           (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
           m_internal;
      auStack_88._8_8_ = 0;
      auStack_78._0_8_ = auStack_78._0_8_ & 0xffffffff00000000;
      auStack_78._8_8_ =
           (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
           m_internal;
      uStack_68._0_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      uStack_68._4_4_ = 0;
      auStack_60._0_8_ = auStack_60._0_8_ & 0xffffffff00000000;
      pDVar1 = &this->m_updateBuilder;
      LStack_90.m_binding = 0;
      LStack_90.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                (pDVar1,descriptorSet,&LStack_90,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                 (VkDescriptorBufferInfo *)&VStack_48.offset);
      LStack_90.m_binding = 1;
      LStack_90.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                (pDVar1,descriptorSet,&LStack_90,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,
                 (VkDescriptorImageInfo *)(auStack_60 + 8));
      DVar3 = this->m_updateMethod;
      if ((this->m_isImmutableSampler & DVar3 != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) != 0)
      goto LAB_00541cbc;
      SVar2 = this->m_shaderInterface;
      if (SVar2 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        LStack_90.m_binding = 2;
        LStack_90.m_arrayElement = 0;
        ::vk::DescriptorSetUpdateBuilder::writeArray
                  (pDVar1,descriptorSet,&LStack_90,VK_DESCRIPTOR_TYPE_SAMPLER,2,
                   (VkDescriptorImageInfo *)auStack_88);
      }
      else {
        if (SVar2 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
          pVVar4 = (VkDescriptorImageInfo *)(auStack_78 + 8);
          LStack_90.m_binding = 2;
          LStack_90.m_arrayElement = 0;
          ::vk::DescriptorSetUpdateBuilder::writeSingle
                    (pDVar1,descriptorSet,&LStack_90,VK_DESCRIPTOR_TYPE_SAMPLER,
                     (VkDescriptorImageInfo *)auStack_88);
          LStack_90.m_binding = 3;
          LStack_90.m_arrayElement = 0;
        }
        else {
          if (SVar2 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_00541cb9;
          LStack_90.m_binding = 2;
          LStack_90.m_arrayElement = 0;
          pVVar4 = (VkDescriptorImageInfo *)auStack_88;
        }
        ::vk::DescriptorSetUpdateBuilder::writeSingle
                  (pDVar1,descriptorSet,&LStack_90,VK_DESCRIPTOR_TYPE_SAMPLER,pVVar4);
      }
LAB_00541cb9:
      DVar3 = this->m_updateMethod;
LAB_00541cbc:
      if (DVar3 == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
        ::vk::DescriptorSetUpdateBuilder::update(pDVar1,this->m_vki,this->m_device);
      }
      return;
    }
    goto vkt_BindingModel_anon_unknown_1_ImageSampleComputeInstance_writeImageSamplerDescriptorSet;
  case DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE:
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSetWithTemplate
                (this,descriptorSet,layout,false,(VkPipelineLayout)0x0);
      return;
    }
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,false,(VkPipelineLayout)0x0);
      return;
    }
    break;
  case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH:
    if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) {
        return;
      }
      writeSamplerDescriptorSet(this,descriptorSet);
      return;
    }
vkt_BindingModel_anon_unknown_1_ImageSampleComputeInstance_writeImageSamplerDescriptorSet:
    VStack_48.buffer.m_internal =
         (this->m_result).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
         m_internal;
    VStack_48.offset = 0;
    VStack_48.range = 0x40;
    if ((this->m_isImmutableSampler & this->m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) ==
        0) {
      auStack_78._0_8_ =
           (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
           m_internal;
      auStack_60._0_8_ =
           (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
           m_internal;
    }
    else {
      auStack_78._0_8_ = 0;
      auStack_60._0_8_ = 0;
    }
    auStack_78._8_8_ =
         (this->m_images).super_ImageInstanceImages.m_imageViewA.
         super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    uStack_68._0_4_ = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    auStack_60._8_8_ =
         (this->m_images).super_ImageInstanceImages.m_imageViewB.
         super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    dStack_50 = CONCAT44(dStack_50._4_4_,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
    pDVar1 = &this->m_updateBuilder;
    auStack_88._8_8_ = 0;
    LStack_90.m_binding = 0x541d7d;
    LStack_90.m_arrayElement = 0;
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (pDVar1,descriptorSet,(Location *)(auStack_88 + 8),VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
               &VStack_48);
    SVar2 = this->m_shaderInterface;
    if (SVar2 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
      auStack_88._8_8_ = 1;
      LStack_90.m_binding = 0x541e1a;
      LStack_90.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::writeArray
                (pDVar1,descriptorSet,(Location *)(auStack_88 + 8),
                 VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,2,(VkDescriptorImageInfo *)auStack_78);
    }
    else {
      if (SVar2 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
        pVVar4 = (VkDescriptorImageInfo *)auStack_60;
        auStack_88._8_8_ = 1;
        LStack_90.m_binding = 0x541dd8;
        LStack_90.m_arrayElement = 0;
        ::vk::DescriptorSetUpdateBuilder::writeSingle
                  (pDVar1,descriptorSet,(Location *)(auStack_88 + 8),
                   VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,(VkDescriptorImageInfo *)auStack_78);
        auStack_88._8_8_ = 2;
      }
      else {
        if (SVar2 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_00541e1a;
        auStack_88._8_8_ = 1;
        pVVar4 = (VkDescriptorImageInfo *)auStack_78;
      }
      LStack_90.m_binding = 0x541df5;
      LStack_90.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                (pDVar1,descriptorSet,(Location *)(auStack_88 + 8),
                 VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,pVVar4);
    }
LAB_00541e1a:
    if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
      LStack_90.m_binding = 0x541e30;
      LStack_90.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::update(pDVar1,this->m_vki,this->m_device);
    }
    return;
  case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE:
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,true,pipelineLayout);
      return;
    }
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,true,pipelineLayout);
      return;
    }
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeDescriptorSet (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, vk::VkPipelineLayout pipelineLayout)
{
	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSetWithTemplate(descriptorSet, layout);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSetWithTemplate(descriptorSet, layout);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSetWithTemplate(descriptorSet, layout, true, pipelineLayout);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSetWithTemplate(descriptorSet, layout, true, pipelineLayout);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSet(descriptorSet);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSet(descriptorSet);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSet(descriptorSet);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSet(descriptorSet);
		else
			DE_FATAL("Impossible");
	}
}